

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O1

void websocket_write_impl
               (intptr_t fd,void *data,size_t len,char text,char first,char last,char client)

{
  fio_write_args_s options;
  byte *target;
  uint64_t uVar1;
  byte opcode;
  uchar first_00;
  uchar rsv;
  int in_stack_ffffffffffffff68;
  undefined1 local_38;
  undefined7 uStack_37;
  
  while (rsv = (uchar)in_stack_ffffffffffffff68, first_00 = first, 0x3000 < len) {
    do {
      first = '\0';
      in_stack_ffffffffffffff68 = (int)client;
      websocket_write_impl(fd,data,0x3000,text,first_00,'\0',client);
      data = (void *)((long)data + 0x3000);
      len = len - 0x3000;
      first_00 = first;
    } while (0x3000 < len);
    last = '\x01';
  }
  target = (byte *)fio_malloc(len + 0x10);
  opcode = (text == '\0') + 1;
  if (client == '\0') {
    if (first == '\0') {
      opcode = 0;
    }
    *target = last << 7 | opcode;
    if (len < 0x7e) {
      target[1] = (byte)len;
      memcpy(target + 2,data,len);
      uVar1 = len + 2;
    }
    else {
      target[1] = 0x7e;
      target[2] = (byte)(len >> 8);
      target[3] = (byte)len;
      memcpy(target + 4,data,len);
      uVar1 = len + 4;
    }
  }
  else {
    uVar1 = websocket_client_wrap(target,data,len,opcode,first,last,rsv);
  }
  options.after.dealloc = fio_free;
  options.data.buffer = target;
  options.length = uVar1;
  options.offset = 0;
  options._32_8_ = CONCAT71(uStack_37,local_38) & 0xfffffffffffffff0;
  fio_write2_fn(fd,options);
  return;
}

Assistant:

static void websocket_write_impl(intptr_t fd, void *data, size_t len, char text,
                                 char first, char last, char client) {
  if (len <= WS_MAX_FRAME_SIZE) {
    void *buff = fio_malloc(len + 16);
    len = (client ? websocket_client_wrap(buff, data, len, (text ? 1 : 2),
                                          first, last, 0)
                  : websocket_server_wrap(buff, data, len, (text ? 1 : 2),
                                          first, last, 0));
    fio_write2(fd, .data.buffer = buff, .length = len,
               .after.dealloc = fio_free);
  } else {
    /* frame fragmentation is better for large data then large frames */
    while (len > WS_MAX_FRAME_SIZE) {
      websocket_write_impl(fd, data, WS_MAX_FRAME_SIZE, text, first, 0, client);
      data = ((uint8_t *)data) + WS_MAX_FRAME_SIZE;
      first = 0;
      len -= WS_MAX_FRAME_SIZE;
    }
    websocket_write_impl(fd, data, len, text, first, 1, client);
  }
  return;
}